

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

ArchType parseArch(StringRef ArchName)

{
  int iVar1;
  ArchType AVar2;
  ISAKind IVar3;
  EndianKind EVar4;
  ProfileKind PVar5;
  uint uVar6;
  ArchType *pAVar7;
  undefined *puVar8;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar9;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  char acVar10 [4];
  ARM *this;
  bool bVar11;
  ArchType AVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  StringRef SVar17;
  StringRef Arch;
  StringRef Arch_00;
  bool local_4e;
  Optional<llvm::Triple::ArchType> local_38;
  
  SVar17.Data = (char *)ArchName.Length;
  this = (ARM *)ArchName.Data;
  local_38.Storage.hasVal = false;
  if (SVar17.Data == &DAT_00000004) {
    if (*(int *)this == 0x36383369) {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x1f;
      local_38.Storage.hasVal = true;
      bVar16 = true;
      goto LAB_001572b6;
    }
    bVar14 = false;
    bVar15 = false;
    bVar16 = false;
    if (*(int *)this != 0x36383469) goto LAB_001572be;
LAB_00157354:
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(char  [4])0x1f;
    bVar14 = bVar15;
LAB_0015736a:
    local_38.Storage.hasVal = true;
    bVar16 = true;
LAB_00157375:
    bVar15 = SVar17.Data != &DAT_00000007;
    if ((bVar15 || bVar16) || (iVar1 = bcmp(this,"x86_64h",7), iVar1 != 0)) goto LAB_0015739f;
    acVar10[0] = ' ';
    acVar10[1] = '\0';
    acVar10[2] = '\0';
    acVar10[3] = '\0';
LAB_00157b10:
    local_38.Storage.hasVal = true;
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(AlignedCharArray<4UL,_4UL>)acVar10;
  }
  else {
    bVar16 = false;
LAB_001572b6:
    bVar14 = SVar17.Data != &DAT_00000004;
LAB_001572be:
    bVar15 = bVar14;
    if ((((((!bVar14 && !bVar16) && (*(int *)this == 0x36383569)) ||
          ((!bVar14 && !bVar16 && (*(int *)this == 0x36383669)))) ||
         ((!bVar14 && !bVar16 && (*(int *)this == 0x36383769)))) ||
        ((!bVar14 && !bVar16 && (*(int *)this == 0x36383869)))) ||
       ((!bVar14 && !bVar16 && (*(int *)this == 0x36383969)))) goto LAB_00157354;
    if (SVar17.Data == &DAT_00000005 && !bVar16) {
      iVar1 = bcmp(this,"amd64",5);
      if (iVar1 != 0) goto LAB_00157375;
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x20;
      goto LAB_0015736a;
    }
    if (SVar17.Data != (char *)0x6 || bVar16) goto LAB_00157375;
    iVar1 = bcmp(this,"x86_64",6);
    bVar15 = true;
    if (iVar1 == 0) {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x20;
      local_38.Storage.hasVal = true;
      bVar16 = true;
    }
LAB_0015739f:
    local_4e = SVar17.Data == &DAT_00000005;
    bVar11 = SVar17.Data == (char *)0x6;
    acVar10[0] = '\x10';
    acVar10[1] = '\0';
    acVar10[2] = '\0';
    acVar10[3] = '\0';
    if ((((((((!bVar15 && !bVar16) && (iVar1 = bcmp(this,"powerpc",7), iVar1 == 0)) ||
            ((SVar17.Data == (char *)0x3 && !bVar16 && (iVar1 = bcmp(this,"ppc",3), iVar1 == 0))))
           || (((local_4e && !bVar16 && (iVar1 = bcmp(this,"ppc32",5), iVar1 == 0)) ||
               ((acVar10[0] = '\x11', acVar10[1] = '\0', acVar10[2] = '\0', acVar10[3] = '\0',
                SVar17.Data == &DAT_00000009 && !bVar16 &&
                (iVar1 = bcmp(this,"powerpc64",9), iVar1 == 0)))))) ||
          (((SVar17.Data == (char *)0x3 && !bVar16 && (iVar1 = bcmp(this,"ppu",3), iVar1 == 0)) ||
           ((local_4e && !bVar16 && (iVar1 = bcmp(this,"ppc64",5), iVar1 == 0)))))) ||
         ((acVar10[0] = '\x12', acVar10[1] = '\0', acVar10[2] = '\0', acVar10[3] = '\0',
          SVar17.Data == (char *)0xb && !bVar16 &&
          (iVar1 = bcmp(this,"powerpc64le",0xb), iVar1 == 0)))) ||
        ((!bVar15 && !bVar16 && (iVar1 = bcmp(this,"ppc64le",7), iVar1 == 0)))) ||
       ((((acVar10[0] = '\x01', acVar10[1] = '\0', acVar10[2] = '\0', acVar10[3] = '\0',
          bVar11 && !bVar16 && (iVar1 = bcmp(this,"xscale",6), iVar1 == 0)) ||
         ((acVar10[0] = '\x02', acVar10[1] = '\0', acVar10[2] = '\0', acVar10[3] = '\0',
          SVar17.Data == (char *)0x8 && !bVar16 && (*(long *)this == 0x6265656c61637378)))) ||
        ((acVar10[0] = '\x03', acVar10[1] = '\0', acVar10[2] = '\0', acVar10[3] = '\0',
         !bVar15 && !bVar16 && (iVar1 = bcmp(this,"aarch64",7), iVar1 == 0)))))) goto LAB_00157b10;
    if ((SVar17.Data == (char *)0xa && !bVar16) && (iVar1 = bcmp(this,"aarch64_be",10), iVar1 == 0))
    {
      acVar10[0] = '\x04';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((SVar17.Data == (char *)0x3 && !bVar16) && (iVar1 = bcmp(this,"arc",3), iVar1 == 0)) {
      acVar10[0] = '\x05';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((local_4e && !bVar16) && (iVar1 = bcmp(this,"arm64",5), iVar1 == 0)) goto LAB_00157b10;
    if (SVar17.Data == (char *)0x3 && !bVar16) {
      iVar1 = bcmp(this,"arm",3);
      acVar10[0] = '\x01';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      if (iVar1 == 0) goto LAB_00157b10;
    }
    if (local_4e && !bVar16) {
      iVar1 = bcmp(this,"armeb",5);
      acVar10[0] = '\x02';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      if (iVar1 == 0) goto LAB_00157b10;
    }
    if ((local_4e && !bVar16) && (iVar1 = bcmp(this,"thumb",5), iVar1 == 0)) {
      acVar10[0] = '\x1d';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((!bVar15 && !bVar16) && (iVar1 = bcmp(this,"thumbeb",7), iVar1 == 0)) {
      acVar10[0] = '\x1e';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((SVar17.Data == (char *)0x3 && !bVar16) && (iVar1 = bcmp(this,"avr",3), iVar1 == 0)) {
      acVar10[0] = '\x06';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((bVar11 && !bVar16) && (iVar1 = bcmp(this,"msp430",6), iVar1 == 0)) {
      acVar10[0] = '\x0e';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    acVar10[0] = '\n';
    acVar10[1] = '\0';
    acVar10[2] = '\0';
    acVar10[3] = '\0';
    if (((((!bVar14 && !bVar16) && (*(int *)this == 0x7370696d)) ||
         ((bVar11 && !bVar16 && (iVar1 = bcmp(this,"mipseb",6), iVar1 == 0)))) ||
        (((SVar17.Data == &DAT_0000000c && !bVar16 &&
          (iVar1 = bcmp(this,"mipsallegrex",0xc), iVar1 == 0)) ||
         ((acVar10[0] = '\v', acVar10[1] = '\0', acVar10[2] = '\0', acVar10[3] = '\0',
          bVar11 && !bVar16 && (iVar1 = bcmp(this,"mipsel",6), iVar1 == 0)))))) ||
       ((((SVar17.Data == &DAT_0000000e && !bVar16 &&
          (iVar1 = bcmp(this,"mipsallegrexel",0xe), iVar1 == 0)) ||
         ((acVar10[0] = '\f', acVar10[1] = '\0', acVar10[2] = '\0', acVar10[3] = '\0',
          bVar11 && !bVar16 && (iVar1 = bcmp(this,"mips64",6), iVar1 == 0)))) ||
        ((SVar17.Data == (char *)0x8 && !bVar16 && (*(long *)this == 0x626534367370696d))))))
    goto LAB_00157b10;
    if ((SVar17.Data == (char *)0x8 && !bVar16) && (*(long *)this == 0x6c6534367370696d)) {
      acVar10[0] = '\r';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((local_4e && !bVar16) && (iVar1 = bcmp(this,"nios2",5), iVar1 == 0)) {
      acVar10[0] = '\x0f';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((!bVar14 && !bVar16) && (*(int *)this == 0x30303672)) {
      acVar10[0] = '\x13';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((bVar11 && !bVar16) && (iVar1 = bcmp(this,"amdgcn",6), iVar1 == 0)) {
      acVar10[0] = '\x14';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((!bVar15 && !bVar16) && (iVar1 = bcmp(this,"riscv32",7), iVar1 == 0)) {
      acVar10[0] = '\x15';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((!bVar15 && !bVar16) && (iVar1 = bcmp(this,"riscv64",7), iVar1 == 0)) {
      acVar10[0] = '\x16';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((!bVar15 && !bVar16) && (iVar1 = bcmp(this,"hexagon",7), iVar1 == 0)) {
      acVar10[0] = '\t';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    acVar10[0] = '\x1a';
    acVar10[1] = '\0';
    acVar10[2] = '\0';
    acVar10[3] = '\0';
    if (((local_4e && !bVar16) && (iVar1 = bcmp(this,"s390x",5), iVar1 == 0)) ||
       ((!bVar15 && !bVar16 && (iVar1 = bcmp(this,"systemz",7), iVar1 == 0)))) goto LAB_00157b10;
    if ((local_4e && !bVar16) && (iVar1 = bcmp(this,"sparc",5), iVar1 == 0)) {
      acVar10[0] = '\x17';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((!bVar15 && !bVar16) && (iVar1 = bcmp(this,"sparcel",7), iVar1 == 0)) {
      acVar10[0] = '\x19';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    acVar10[0] = '\x18';
    acVar10[1] = '\0';
    acVar10[2] = '\0';
    acVar10[3] = '\0';
    if (((!bVar15 && !bVar16) && (iVar1 = bcmp(this,"sparcv9",7), iVar1 == 0)) ||
       ((!bVar15 && !bVar16 && (iVar1 = bcmp(this,"sparc64",7), iVar1 == 0)))) goto LAB_00157b10;
    if ((SVar17.Data == (char *)0x3 && !bVar16) && (iVar1 = bcmp(this,"tce",3), iVar1 == 0)) {
      acVar10[0] = '\x1b';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((local_4e && !bVar16) && (iVar1 = bcmp(this,"tcele",5), iVar1 == 0)) {
      acVar10[0] = '\x1c';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((local_4e && !bVar16) && (iVar1 = bcmp(this,"xcore",5), iVar1 == 0)) {
      acVar10[0] = '!';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((local_4e && !bVar16) && (iVar1 = bcmp(this,"nvptx",5), iVar1 == 0)) {
      acVar10[0] = '\"';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((!bVar15 && !bVar16) && (iVar1 = bcmp(this,"nvptx64",7), iVar1 == 0)) {
      acVar10[0] = '#';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((!bVar14 && !bVar16) && (*(int *)this == 0x3233656c)) {
      acVar10[0] = '$';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((!bVar14 && !bVar16) && (*(int *)this == 0x3436656c)) {
      acVar10[0] = '%';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((local_4e && !bVar16) && (iVar1 = bcmp(this,"amdil",5), iVar1 == 0)) {
      acVar10[0] = '&';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((!bVar15 && !bVar16) && (iVar1 = bcmp(this,"amdil64",7), iVar1 == 0)) {
      acVar10[0] = '\'';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((local_4e && !bVar16) && (iVar1 = bcmp(this,"hsail",5), iVar1 == 0)) {
      acVar10[0] = '(';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((!bVar15 && !bVar16) && (iVar1 = bcmp(this,"hsail64",7), iVar1 == 0)) {
      acVar10[0] = ')';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((!bVar14 && !bVar16) && (*(int *)this == 0x72697073)) {
      acVar10[0] = '*';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((bVar11 && !bVar16) && (iVar1 = bcmp(this,"spir64",6), iVar1 == 0)) {
      acVar10[0] = '+';
      acVar10[1] = '\0';
      acVar10[2] = '\0';
      acVar10[3] = '\0';
      goto LAB_00157b10;
    }
    if ((bVar16 || SVar17.Data < &DAT_00000007) || (iVar1 = bcmp(this,"kalimba",7), iVar1 != 0)) {
      if ((local_4e && !bVar16) && (iVar1 = bcmp(this,"lanai",5), iVar1 == 0)) {
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
             (AlignedCharArray<4UL,_4UL>)(char  [4])0x2e;
        goto LAB_00157e46;
      }
      if ((local_4e && !bVar16) && (iVar1 = bcmp(this,"shave",5), iVar1 == 0)) {
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
             (AlignedCharArray<4UL,_4UL>)(char  [4])0x2d;
        goto LAB_00157e46;
      }
      if ((bVar11 && !bVar16) && (iVar1 = bcmp(this,"wasm32",6), iVar1 == 0)) {
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
             (AlignedCharArray<4UL,_4UL>)(char  [4])0x2f;
        goto LAB_00157e46;
      }
    }
    else {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x2c;
LAB_00157e46:
      local_38.Storage.hasVal = true;
    }
  }
  bVar13 = local_38.Storage.hasVal;
  if (SVar17.Data == (char *)0x6 && local_38.Storage.hasVal == false) {
    iVar1 = bcmp(this,"wasm64",6);
    bVar16 = true;
    if (iVar1 == 0) {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x30;
      local_38.Storage.hasVal = true;
      bVar13 = 1;
    }
LAB_00157b8e:
    if ((!bVar16 && (bVar13 & 1) == 0) && (iVar1 = bcmp(this,"renderscript64",0xe), iVar1 == 0)) {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '2';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
      goto LAB_00157bb8;
    }
    if (bVar13 != 0) goto LAB_00157bc2;
  }
  else {
    bVar16 = SVar17.Data != &DAT_0000000e;
    if ((local_38.Storage.hasVal != false || bVar16) ||
       (iVar1 = bcmp(this,"renderscript32",0xe), iVar1 != 0)) goto LAB_00157b8e;
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '1';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
LAB_00157bb8:
    local_38.Storage.hasVal = true;
LAB_00157bc2:
    pAVar7 = llvm::Optional<llvm::Triple::ArchType>::getPointer(&local_38);
    if (*pAVar7 != UnknownArch) {
      return *pAVar7;
    }
  }
  if (((SVar17.Data < (char *)0x3) ||
      ((iVar1 = bcmp(this,"arm",3), sVar9 = extraout_RDX, iVar1 != 0 &&
       ((SVar17.Data <= &DAT_00000004 ||
        (iVar1 = bcmp(this,"thumb",5), sVar9 = extraout_RDX_00, iVar1 != 0)))))) &&
     ((SVar17.Data < &DAT_00000007 ||
      (iVar1 = bcmp(this,"aarch64",7), sVar9 = extraout_RDX_01, iVar1 != 0)))) {
    if (SVar17.Data < (char *)0x3) {
      return UnknownArch;
    }
    iVar1 = bcmp(this,"bpf",3);
    if (iVar1 != 0) {
      return UnknownArch;
    }
    AVar2 = parseBPFArch(ArchName);
    return AVar2;
  }
  SVar17.Length = sVar9;
  IVar3 = llvm::ARM::parseArchISA(this,SVar17);
  Arch.Length = extraout_RDX_02;
  Arch.Data = SVar17.Data;
  EVar4 = llvm::ARM::parseArchEndian(this,Arch);
  if (EVar4 == BIG) {
    AVar2 = UnknownArch;
    if (2 < IVar3 - ARM) goto LAB_00157ce6;
    puVar8 = &DAT_0018b4d0;
  }
  else {
    AVar2 = UnknownArch;
    if ((EVar4 != LITTLE) || (AVar2 = UnknownArch, 2 < IVar3 - ARM)) goto LAB_00157ce6;
    puVar8 = &DAT_0018b4c4;
  }
  AVar2 = *(ArchType *)(puVar8 + (ulong)(IVar3 - ARM) * 4);
LAB_00157ce6:
  Arch_00.Length = extraout_RDX_03;
  Arch_00.Data = SVar17.Data;
  SVar17 = llvm::ARM::getCanonicalArchName(this,Arch_00);
  AVar12 = UnknownArch;
  if ((SVar17.Length != 0) &&
     ((SVar17.Length == 1 || IVar3 != THUMB ||
      ((*(short *)SVar17.Data != 0x3276 && (*(short *)SVar17.Data != 0x3376)))))) {
    PVar5 = llvm::ARM::parseArchProfile(SVar17);
    uVar6 = llvm::ARM::parseArchVersion(SVar17);
    AVar12 = AVar2;
    if (uVar6 == 6 && PVar5 == M) {
      AVar12 = (EVar4 == BIG) + thumb;
    }
  }
  return AVar12;
}

Assistant:

static Triple::ArchType parseArch(StringRef ArchName) {
  auto AT = StringSwitch<Triple::ArchType>(ArchName)
    .Cases("i386", "i486", "i586", "i686", Triple::x86)
    // FIXME: Do we need to support these?
    .Cases("i786", "i886", "i986", Triple::x86)
    .Cases("amd64", "x86_64", "x86_64h", Triple::x86_64)
    .Cases("powerpc", "ppc", "ppc32", Triple::ppc)
    .Cases("powerpc64", "ppu", "ppc64", Triple::ppc64)
    .Cases("powerpc64le", "ppc64le", Triple::ppc64le)
    .Case("xscale", Triple::arm)
    .Case("xscaleeb", Triple::armeb)
    .Case("aarch64", Triple::aarch64)
    .Case("aarch64_be", Triple::aarch64_be)
    .Case("arc", Triple::arc)
    .Case("arm64", Triple::aarch64)
    .Case("arm", Triple::arm)
    .Case("armeb", Triple::armeb)
    .Case("thumb", Triple::thumb)
    .Case("thumbeb", Triple::thumbeb)
    .Case("avr", Triple::avr)
    .Case("msp430", Triple::msp430)
    .Cases("mips", "mipseb", "mipsallegrex", Triple::mips)
    .Cases("mipsel", "mipsallegrexel", Triple::mipsel)
    .Cases("mips64", "mips64eb", Triple::mips64)
    .Case("mips64el", Triple::mips64el)
    .Case("nios2", Triple::nios2)
    .Case("r600", Triple::r600)
    .Case("amdgcn", Triple::amdgcn)
    .Case("riscv32", Triple::riscv32)
    .Case("riscv64", Triple::riscv64)
    .Case("hexagon", Triple::hexagon)
    .Cases("s390x", "systemz", Triple::systemz)
    .Case("sparc", Triple::sparc)
    .Case("sparcel", Triple::sparcel)
    .Cases("sparcv9", "sparc64", Triple::sparcv9)
    .Case("tce", Triple::tce)
    .Case("tcele", Triple::tcele)
    .Case("xcore", Triple::xcore)
    .Case("nvptx", Triple::nvptx)
    .Case("nvptx64", Triple::nvptx64)
    .Case("le32", Triple::le32)
    .Case("le64", Triple::le64)
    .Case("amdil", Triple::amdil)
    .Case("amdil64", Triple::amdil64)
    .Case("hsail", Triple::hsail)
    .Case("hsail64", Triple::hsail64)
    .Case("spir", Triple::spir)
    .Case("spir64", Triple::spir64)
    .StartsWith("kalimba", Triple::kalimba)
    .Case("lanai", Triple::lanai)
    .Case("shave", Triple::shave)
    .Case("wasm32", Triple::wasm32)
    .Case("wasm64", Triple::wasm64)
    .Case("renderscript32", Triple::renderscript32)
    .Case("renderscript64", Triple::renderscript64)
    .Default(Triple::UnknownArch);

  // Some architectures require special parsing logic just to compute the
  // ArchType result.
  if (AT == Triple::UnknownArch) {
    if (ArchName.startswith("arm") || ArchName.startswith("thumb") ||
        ArchName.startswith("aarch64"))
      return parseARMArch(ArchName);
    if (ArchName.startswith("bpf"))
      return parseBPFArch(ArchName);
  }

  return AT;
}